

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O2

void __thiscall BamTools::BamAlignment::RemoveTag(BamAlignment *this,string *tag)

{
  uint uVar1;
  ulong uVar2;
  pointer __src;
  uint uVar3;
  pointer pcVar4;
  bool bVar5;
  char *__s;
  ulong __n;
  RaiiBuffer newTagData;
  uint originalTagDataLength;
  uint local_54;
  pointer local_50;
  RaiiBuffer local_48;
  uint local_34;
  
  if ((this->SupportData).HasCoreOnly == true) {
    BuildCharData(this);
  }
  uVar2 = (this->TagData)._M_string_length;
  if (uVar2 != 0) {
    __src = (this->TagData)._M_dataplus._M_p;
    local_54 = 0;
    local_50 = __src;
    local_34 = (uint)uVar2;
    bVar5 = FindTag(this,tag,&local_50,&local_34,&local_54);
    if (bVar5) {
      __n = uVar2 & 0xffffffff;
      __s = (char *)operator_new__(__n);
      memset(__s,0,__n);
      pcVar4 = local_50;
      uVar3 = local_54;
      uVar1 = local_54 - 3;
      local_48.Buffer = __s;
      local_48.NumBytes = __n;
      memcpy(__s,__src,(ulong)uVar1);
      local_54 = uVar3;
      local_50 = pcVar4;
      bVar5 = SkipToNextTag(this,pcVar4[-1],&local_50,&local_54);
      if (bVar5) {
        memcpy(__s + uVar1,local_50,(ulong)(((uint)uVar2 - uVar3) + (uVar1 - local_54) + 3));
        std::__cxx11::string::assign((char *)&this->TagData,(ulong)__s);
      }
      RaiiBuffer::~RaiiBuffer(&local_48);
    }
  }
  return;
}

Assistant:

void BamAlignment::RemoveTag(const std::string& tag)
{

    // if char data not populated, do that first
    if (SupportData.HasCoreOnly) BuildCharData();

    // skip if no tags available
    if (TagData.empty()) return;

    // localize the tag data
    char* pOriginalTagData = (char*)TagData.data();
    char* pTagData = pOriginalTagData;
    const unsigned int originalTagDataLength = TagData.size();
    unsigned int newTagDataLength = 0;
    unsigned int numBytesParsed = 0;

    // skip if tag not found
    if (!FindTag(tag, pTagData, originalTagDataLength, numBytesParsed)) return;

    // otherwise, remove it
    RaiiBuffer newTagData(originalTagDataLength);

    // copy original tag data up til desired tag
    pTagData -= 3;
    numBytesParsed -= 3;
    const unsigned int beginningTagDataLength = numBytesParsed;
    newTagDataLength += beginningTagDataLength;
    memcpy(newTagData.Buffer, pOriginalTagData, numBytesParsed);

    // attemp to skip to next tag
    const char* pTagStorageType = pTagData + 2;
    pTagData += 3;
    numBytesParsed += 3;
    if (SkipToNextTag(*pTagStorageType, pTagData, numBytesParsed)) {

        // squeeze remaining tag data
        const unsigned int skippedDataLength = (numBytesParsed - beginningTagDataLength);
        const unsigned int endTagDataLength =
            originalTagDataLength - beginningTagDataLength - skippedDataLength;
        memcpy(newTagData.Buffer + beginningTagDataLength, pTagData, endTagDataLength);

        // save modified tag data in alignment
        TagData.assign(newTagData.Buffer, beginningTagDataLength + endTagDataLength);
    }
}